

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O0

void __thiscall
QProxyStyle::drawControl
          (QProxyStyle *this,ControlElement element,QStyleOption *option,QPainter *painter,
          QWidget *widget)

{
  QStyle *pQVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  QProxyStylePrivate *in_RDI;
  undefined8 in_R8;
  QProxyStylePrivate *d;
  
  d_func((QProxyStyle *)0x408efa);
  QProxyStylePrivate::ensureBaseStyle(in_RDI);
  pQVar1 = QPointer<QStyle>::operator->((QPointer<QStyle> *)0x408f1a);
  (**(code **)(*(long *)pQVar1 + 0xb8))(pQVar1,in_ESI,in_RDX,in_RCX,in_R8);
  return;
}

Assistant:

void QProxyStyle::drawControl(ControlElement element, const QStyleOption *option, QPainter *painter, const QWidget *widget) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    d->baseStyle->drawControl(element, option, painter, widget);
}